

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::LRUCache::~LRUCache(LRUCache *this)

{
  LRUHandle *pLVar1;
  LRUHandle **ppLVar2;
  LRUHandle *e;
  
  e = (this->lru_).next;
  while( true ) {
    if (e == &this->lru_) {
      ppLVar2 = (this->table_).list_;
      if (ppLVar2 != (LRUHandle **)0x0) {
        operator_delete__(ppLVar2);
      }
      port::Mutex::~Mutex(&this->mutex_);
      return;
    }
    if (e->refs != 1) break;
    pLVar1 = e->next;
    Unref(this,e);
    e = pLVar1;
  }
  __assert_fail("e->refs == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/util/cache.cc"
                ,0xc4,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
}

Assistant:

LRUCache::~LRUCache() {
            for (LRUHandle *e = lru_.next; e != &lru_;) {
                LRUHandle *next = e->next;
                assert(e->refs == 1);  // Error if caller has an unreleased handle
                Unref(e);
                e = next;
            }
        }